

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_check_mandatory_subtree
              (lyd_node *tree,lyd_node *subtree,lyd_node *last_parent,lys_node *schema,int toplevel,
              int options)

{
  long lVar1;
  LYS_NODE LVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ly_set *set;
  lys_node *plVar6;
  lys_node *node;
  lyd_node *last_parent_00;
  lyd_node *plVar7;
  lys_node *schema_00;
  ulong uVar8;
  
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xcf,
                  "int lyd_check_mandatory_subtree(struct lyd_node *, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int)"
                 );
  }
  LVar2 = schema->nodetype;
  if ((LVar2 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) == LYS_UNKNOWN) {
    set = (ly_set *)0x0;
  }
  else {
    set = (ly_set *)calloc(1,0x10);
    if (set == (ly_set *)0x0) {
      iVar3 = 1;
      set = (ly_set *)0x0;
      goto LAB_0015a647;
    }
    plVar7 = tree;
    if (tree == (lyd_node *)0x0 || toplevel == 0) {
      if (subtree != (lyd_node *)0x0 && toplevel == 0) {
        plVar7 = subtree->child;
        goto LAB_0015a373;
      }
    }
    else {
LAB_0015a373:
      lyd_get_node_siblings(plVar7,schema,set);
    }
    LVar2 = schema->nodetype;
  }
  if ((int)LVar2 < 0x40) {
    switch(LVar2) {
    case LYS_CONTAINER:
      if ((set->number != 0) ||
         (lVar1._0_2_ = schema[1].flags, lVar1._2_1_ = schema[1].ext_size,
         lVar1._3_1_ = schema[1].iffeature_size, lVar1._4_1_ = schema[1].padding[0],
         lVar1._5_1_ = schema[1].padding[1], lVar1._6_1_ = schema[1].padding[2],
         lVar1._7_1_ = schema[1].padding[3], lVar1 == 0)) {
        for (plVar6 = schema->child; plVar6 != (lys_node *)0x0; plVar6 = plVar6->next) {
          if (set->number == 0) {
            plVar7 = (lyd_node *)0x0;
            last_parent_00 = last_parent;
          }
          else {
            plVar7 = *(set->set).d;
            last_parent_00 = plVar7;
          }
          iVar3 = lyd_check_mandatory_subtree(tree,plVar7,last_parent_00,plVar6,0,options);
          if (iVar3 != 0) goto LAB_0015a642;
        }
      }
      break;
    case LYS_CHOICE:
      plVar7 = tree;
      if (tree != (lyd_node *)0x0 && toplevel != 0) goto LAB_0015a4dc;
      if (subtree != (lyd_node *)0x0 && toplevel == 0) {
        for (plVar7 = subtree->child; plVar7 != (lyd_node *)0x0; plVar7 = plVar7->next) {
LAB_0015a4dc:
          plVar6 = lys_parent(plVar7->schema);
          schema_00 = plVar7->schema;
          while (node = plVar6, node != (lys_node *)0x0) {
            if ((node == schema) ||
               ((node->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN))
            goto LAB_0015a508;
            plVar6 = lys_parent(node);
            schema_00 = node;
          }
          node = (lys_node *)0x0;
LAB_0015a508:
          if (node == schema) {
            if (schema_00 == (lys_node *)0x0) {
              __assert_fail("siter && siter_prev",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                            ,300,
                            "int lyd_check_mandatory_subtree(struct lyd_node *, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int)"
                           );
            }
            iVar4 = lyd_check_mandatory_subtree(tree,subtree,last_parent,schema_00,toplevel,options)
            ;
            goto joined_r0x0015a494;
          }
        }
      }
      if ((lys_node *)schema[1].dsc != (lys_node *)0x0) {
        iVar4 = lyd_check_mandatory_subtree
                          (tree,subtree,last_parent,(lys_node *)schema[1].dsc,toplevel,options);
        goto joined_r0x0015a494;
      }
      if ((schema->flags & 0x40) != 0) {
        ly_vlog(LYE_NOMANDCHOICE,LY_VLOG_LYD,last_parent,schema->name);
LAB_0015a642:
        iVar3 = 1;
        goto LAB_0015a647;
      }
      break;
    case LYS_CHOICE|LYS_CONTAINER:
    case LYS_LEAF|LYS_CONTAINER:
    case LYS_LEAF|LYS_CHOICE:
    case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
      break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
switchD_0015a3ad_caseD_4:
      iVar4 = lyd_check_mandatory_data(tree,last_parent,set,schema,options);
joined_r0x0015a494:
      iVar3 = 1;
      if (iVar4 != 0) goto LAB_0015a647;
      break;
    default:
      if (LVar2 == LYS_LIST) {
        iVar4 = lyd_check_mandatory_data(tree,last_parent,set,schema,options);
        iVar3 = 1;
        if (iVar4 != 0) goto LAB_0015a647;
        uVar5 = set->number;
        if (uVar5 != 0) {
          uVar8 = 0;
          do {
            plVar6 = schema->child;
            if (plVar6 != (lys_node *)0x0) {
              do {
                iVar4 = lyd_check_mandatory_subtree
                                  (tree,(lyd_node *)(set->set).s[uVar8],
                                   (lyd_node *)(set->set).s[uVar8],plVar6,0,options);
                if (iVar4 != 0) goto LAB_0015a647;
                plVar6 = plVar6->next;
              } while (plVar6 != (lys_node *)0x0);
              uVar5 = set->number;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar5);
        }
      }
      else if (LVar2 == LYS_ANYXML) goto switchD_0015a3ad_caseD_4;
    }
  }
  else if ((int)LVar2 < 0x400) {
    if (((LVar2 == LYS_CASE) || (LVar2 == LYS_NOTIF)) || (LVar2 == LYS_INPUT)) {
LAB_0015a437:
      for (plVar6 = schema->child; plVar6 != (lys_node *)0x0; plVar6 = plVar6->next) {
        iVar3 = lyd_check_mandatory_subtree(tree,subtree,last_parent,plVar6,toplevel,options);
        if (iVar3 != 0) goto LAB_0015a642;
      }
    }
  }
  else {
    if ((LVar2 == LYS_OUTPUT) || (LVar2 == LYS_USES)) goto LAB_0015a437;
    if (LVar2 == LYS_ANYDATA) goto switchD_0015a3ad_caseD_4;
  }
  iVar3 = 0;
LAB_0015a647:
  ly_set_free(set);
  return iVar3;
}

Assistant:

static int
lyd_check_mandatory_subtree(struct lyd_node *tree, struct lyd_node *subtree, struct lyd_node *last_parent,
                            struct lys_node *schema, int toplevel, int options)
{
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    struct ly_set *present = NULL;
    unsigned int u;
    int ret = EXIT_FAILURE;

    assert(schema);

    if (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_CONTAINER)) {
        /* data node */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((toplevel && tree) || (!toplevel && subtree)) {
            if (toplevel) {
                lyd_get_node_siblings(tree, schema, present);
            } else {
                lyd_get_node_siblings(subtree->child, schema, present);
            }
        }
    }

    switch (schema->nodetype) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* check the schema item */
        if (lyd_check_mandatory_data(tree, last_parent, present, schema, options)) {
            goto error;
        }
        break;
    case LYS_LIST:
        /* check the schema item */
        if (lyd_check_mandatory_data(tree, last_parent, present, schema, options)) {
            goto error;
        }

        /* go recursively */
        for (u = 0; u < present->number; u++) {
            LY_TREE_FOR(schema->child, siter) {
                if (lyd_check_mandatory_subtree(tree, present->set.d[u], present->set.d[u], siter, 0, options)) {
                    goto error;
                }
            }
        }
        break;

    case LYS_CONTAINER:
        if (present->number || !((struct lys_node_container *)schema)->presence) {
            /* if we have existing or non-presence container, go recursively */
            LY_TREE_FOR(schema->child, siter) {
                if (lyd_check_mandatory_subtree(tree, present->number ? present->set.d[0] : NULL,
                                                present->number ? present->set.d[0] : last_parent,
                                                siter, 0, options)) {
                    goto error;
                }
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data tree from the choice */
        iter = NULL;
        if ((toplevel && tree) || (!toplevel && subtree)) {
            LY_TREE_FOR(toplevel ? tree : subtree->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_check_mandatory_subtree(tree, subtree, last_parent, ((struct lys_node_choice *)schema)->dflt,
                                                toplevel, options)) {
                    goto error;
                }
            } else if (schema->flags & LYS_MAND_TRUE) {
                /* choice requires some data to be instantiated */
                LOGVAL(LYE_NOMANDCHOICE, LY_VLOG_LYD, last_parent, schema->name);
                goto error;
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_check_mandatory_subtree(tree, subtree, last_parent, siter_prev, toplevel, options)) {
                goto error;
            }
        }
        break;
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* go recursively */
        LY_TREE_FOR(schema->child, siter) {
            if (lyd_check_mandatory_subtree(tree, subtree, last_parent, siter, toplevel, options)) {
                goto error;
            }
        }
        break;
    default:
        /* stop */
        break;
    }

    ret = EXIT_SUCCESS;

error:
    ly_set_free(present);
    return ret;
}